

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuResource.cpp
# Opt level: O0

void __thiscall tcu::FileResource::FileResource(FileResource *this,char *filename)

{
  FILE *pFVar1;
  ResourceError *this_00;
  allocator<char> local_39;
  string local_38;
  char *local_18;
  char *filename_local;
  FileResource *this_local;
  
  local_18 = filename;
  filename_local = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,filename,&local_39);
  Resource::Resource(&this->super_Resource,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  (this->super_Resource)._vptr_Resource = (_func_int **)&PTR__FileResource_004052d8;
  pFVar1 = fopen(local_18,"rb");
  this->m_file = (FILE *)pFVar1;
  if (this->m_file == (FILE *)0x0) {
    this_00 = (ResourceError *)__cxa_allocate_exception(0x38);
    ResourceError::ResourceError
              (this_00,"Failed to open file",local_18,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/common/tcuResource.cpp"
               ,0x35);
    __cxa_throw(this_00,&ResourceError::typeinfo,ResourceError::~ResourceError);
  }
  return;
}

Assistant:

FileResource::FileResource (const char* filename)
	: Resource(std::string(filename))
{
	m_file = fopen(filename, "rb");
	if (!m_file)
		throw ResourceError("Failed to open file", filename, __FILE__, __LINE__);
}